

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::KillLocationAndComponentDecorations
          (InterfaceVariableScalarReplacement *this,uint32_t var_id)

{
  uint32_t id;
  IRContext *this_00;
  DecorationManager *this_01;
  anon_class_1_0_00000001 local_39;
  function<bool_(const_spvtools::opt::Instruction_&)> local_38;
  uint32_t local_14;
  InterfaceVariableScalarReplacement *pIStack_10;
  uint32_t var_id_local;
  InterfaceVariableScalarReplacement *this_local;
  
  local_14 = var_id;
  pIStack_10 = this;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_decoration_mgr(this_00);
  id = local_14;
  std::function<bool(spvtools::opt::Instruction_const&)>::
  function<spvtools::opt::InterfaceVariableScalarReplacement::KillLocationAndComponentDecorations(unsigned_int)::__0,void>
            ((function<bool(spvtools::opt::Instruction_const&)> *)&local_38,&local_39);
  analysis::DecorationManager::RemoveDecorationsFrom(this_01,id,&local_38);
  std::function<bool_(const_spvtools::opt::Instruction_&)>::~function(&local_38);
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::KillLocationAndComponentDecorations(
    uint32_t var_id) {
  context()->get_decoration_mgr()->RemoveDecorationsFrom(
      var_id, [](const Instruction& inst) {
        spv::Decoration decoration = spv::Decoration(
            inst.GetSingleWordInOperand(kOpDecorateDecorationInOperandIndex));
        return decoration == spv::Decoration::Location ||
               decoration == spv::Decoration::Component;
      });
}